

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O2

void __thiscall HACD::HACD::CreateGraph(HACD *this)

{
  _Rb_tree_header *p_Var1;
  Graph *this_00;
  Vec3<long> *pVVar2;
  ulong uVar3;
  Vec3<double> *pVVar4;
  long lVar5;
  pointer psVar6;
  int i;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  size_t v;
  ulong uVar16;
  long lVar17;
  size_t t_1;
  long lVar18;
  size_t t;
  ulong uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double local_4f0;
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  vertexToTriangles;
  unsigned_long_long tr2 [3];
  unsigned_long_long tr1 [3];
  char msg [1024];
  
  vertexToTriangles.
  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexToTriangles.
  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexToTriangles.
  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ::resize(&vertexToTriangles,this->m_nPoints);
  lVar15 = 0;
  for (uVar19 = 0; uVar19 < this->m_nTriangles; uVar19 = uVar19 + 1) {
    msg._0_8_ = uVar19;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    _M_insert_unique<long>
              (&vertexToTriangles.
                super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(long *)((long)this->m_triangles->m_data + lVar15)]._M_t,(long *)msg);
    msg._0_8_ = uVar19;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    _M_insert_unique<long>
              (&vertexToTriangles.
                super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(long *)((long)this->m_triangles->m_data + lVar15 + 8)]._M_t,(long *)msg);
    msg._0_8_ = uVar19;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    _M_insert_unique<long>
              (&vertexToTriangles.
                super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(long *)((long)this->m_triangles->m_data + lVar15 + 0x10)]._M_t,(long *)msg);
    lVar15 = lVar15 + 0x18;
  }
  this_00 = &this->m_graph;
  Graph::Clear(this_00);
  Graph::Allocate(this_00,this->m_nTriangles,this->m_nTriangles * 5);
  for (uVar19 = 0; uVar19 < this->m_nPoints; uVar19 = uVar19 + 1) {
    p_Var1 = &vertexToTriangles.
              super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_t._M_impl.super__Rb_tree_header;
    for (p_Var9 = (p_Var1->_M_header)._M_left; (_Rb_tree_header *)p_Var9 != p_Var1;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      lVar15 = *(long *)(p_Var9 + 1);
      pVVar2 = this->m_triangles;
      uVar14 = pVVar2[lVar15].m_data[1];
      uVar16 = pVVar2[lVar15].m_data[0];
      uVar3 = pVVar2[lVar15].m_data[2];
      tr1[0] = (uVar14 << 0x20) + uVar16;
      if (uVar14 < uVar16) {
        tr1[0] = (uVar16 << 0x20) + uVar14;
      }
      tr1[1] = (uVar3 << 0x20) + uVar14;
      if (uVar3 < uVar14) {
        tr1[1] = (uVar14 << 0x20) + uVar3;
      }
      p_Var7 = p_Var9;
      tr1[2] = (uVar16 << 0x20) + uVar3;
      if (uVar16 < uVar3) {
        tr1[2] = (uVar3 << 0x20) + uVar16;
      }
      while (p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7),
            (_Rb_tree_header *)p_Var7 != p_Var1) {
        lVar18 = *(long *)(p_Var7 + 1);
        pVVar2 = this->m_triangles;
        uVar14 = pVVar2[lVar18].m_data[1];
        uVar16 = pVVar2[lVar18].m_data[0];
        uVar3 = pVVar2[lVar18].m_data[2];
        tr2[0] = (uVar14 << 0x20) + uVar16;
        if (uVar14 < uVar16) {
          tr2[0] = (uVar16 << 0x20) + uVar14;
        }
        tr2[1] = (uVar3 << 0x20) + uVar14;
        if (uVar3 < uVar14) {
          tr2[1] = (uVar14 << 0x20) + uVar3;
        }
        tr2[2] = (uVar16 << 0x20) + uVar3;
        if (uVar16 < uVar3) {
          tr2[2] = (uVar3 << 0x20) + uVar16;
        }
        iVar13 = 0;
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
            iVar13 = iVar13 + (uint)(tr1[lVar8] == tr2[lVar17]);
          }
        }
        if (iVar13 == 1) {
          Graph::AddEdge(this_00,lVar15,lVar18);
        }
      }
    }
  }
  if (0.0 <= this->m_ccConnectDist) {
    Graph::ExtractCCs(this_00);
    if (this->m_callBack != (CallBackFunction)0x0) {
      sprintf(msg,"nCC %lu\n",(this->m_graph).m_nCCs);
      (*this->m_callBack)(msg,0.0,0.0,(this->m_graph).m_nV);
    }
    uVar19 = (this->m_graph).m_nCCs;
    if (1 < uVar19) {
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = '\0';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      std::
      vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ::resize((vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                *)msg,uVar19);
      lVar15 = 0x10;
      lVar18 = 8;
      for (uVar19 = 0; uVar19 < this->m_nTriangles; uVar19 = uVar19 + 1) {
        lVar8 = *(long *)((long)(((this->m_graph).m_vertices.
                                  super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_edges).m_data0 +
                         lVar18 + -0x10) * 0x30;
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   (msg._0_8_ + lVar8),(long *)((long)this->m_triangles->m_data + lVar15 + -0x10));
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   (msg._0_8_ + lVar8),(long *)((long)this->m_triangles->m_data + lVar15 + -8));
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   (lVar8 + msg._0_8_),(long *)((long)this->m_triangles->m_data + lVar15));
        lVar15 = lVar15 + 0x18;
        lVar18 = lVar18 + 0x310;
      }
      uVar19 = (this->m_graph).m_nCCs;
      uVar14 = 0;
      while (uVar14 < uVar19) {
        lVar15 = uVar14 * 0x30;
        uVar14 = uVar14 + 1;
        for (uVar16 = uVar14; uVar16 < uVar19; uVar16 = uVar16 + 1) {
          p_Var9 = (_Rb_tree_node_base *)(msg._0_8_ + 8 + lVar15);
          for (p_Var12 = p_Var9->_M_left;
              psVar6 = vertexToTriangles.
                       super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start, p_Var12 != p_Var9;
              p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
            pVVar4 = this->m_points;
            p_Var7 = (_Rb_tree_node_base *)(msg._0_8_ + 8 + uVar16 * 0x30);
            p_Var11 = p_Var7->_M_left;
            lVar8 = -1;
            local_4f0 = 1.79769313486232e+308;
            lVar18 = lVar8;
            for (; p_Var11 != p_Var7; p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
              lVar17 = *(long *)(p_Var12 + 1);
              lVar5 = *(long *)(p_Var11 + 1);
              dVar21 = pVVar4[lVar17].m_data[1] - pVVar4[lVar5].m_data[1];
              auVar20._8_8_ = 0;
              auVar20._0_8_ = pVVar4[lVar17].m_data[0] - pVVar4[lVar5].m_data[0];
              auVar22._8_8_ = 0;
              auVar22._0_8_ = dVar21 * dVar21;
              auVar20 = vfmadd231sd_fma(auVar22,auVar20,auVar20);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = pVVar4[lVar17].m_data[2] - pVVar4[lVar5].m_data[2];
              auVar20 = vfmadd231sd_fma(auVar20,auVar23,auVar23);
              auVar20 = vsqrtsd_avx(auVar20,auVar20);
              dVar21 = auVar20._0_8_;
              if (dVar21 < local_4f0) {
                p_Var1 = &psVar6[lVar5]._M_t._M_impl.super__Rb_tree_header;
                lVar18 = *(long *)(psVar6[lVar17]._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_left + 1);
                for (p_Var10 = (p_Var1->_M_header)._M_left; local_4f0 = dVar21,
                    (_Rb_tree_header *)p_Var10 != p_Var1;
                    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
                  lVar8 = *(long *)(p_Var10 + 1);
                  if (lVar8 != lVar18) goto LAB_00d8aaa1;
                }
                lVar8 = -1;
              }
LAB_00d8aaa1:
            }
            if (((local_4f0 <= this->m_ccConnectDist) && (-1 < lVar18)) && (-1 < lVar8)) {
              Graph::AddEdge(this_00,lVar18,lVar8);
            }
          }
          uVar19 = (this->m_graph).m_nCCs;
        }
      }
      std::
      vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ::~vector((vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                 *)msg);
    }
  }
  std::
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ::~vector(&vertexToTriangles);
  return;
}

Assistant:

void HACD::CreateGraph()
    {
		// vertex to triangle adjacency information
		std::vector< std::set<long> >  vertexToTriangles;		
		vertexToTriangles.resize(m_nPoints);
		for(size_t t = 0; t < m_nTriangles; ++t)
		{
			vertexToTriangles[m_triangles[t].X()].insert(static_cast<long>(t));
			vertexToTriangles[m_triangles[t].Y()].insert(static_cast<long>(t));
			vertexToTriangles[m_triangles[t].Z()].insert(static_cast<long>(t));
		}

		m_graph.Clear();
		m_graph.Allocate(m_nTriangles, 5 * m_nTriangles);
		unsigned long long tr1[3];
		unsigned long long tr2[3];
        long i1, j1, k1, i2, j2, k2;
        long t1, t2;
        for (size_t v = 0; v < m_nPoints; v++) 
		{
			std::set<long>::const_iterator it1(vertexToTriangles[v].begin()), itEnd(vertexToTriangles[v].end()); 
			for(; it1 != itEnd; ++it1)
			{
                t1 = *it1;
                i1 = m_triangles[t1].X();
                j1 = m_triangles[t1].Y();
                k1 = m_triangles[t1].Z();
				tr1[0] = GetEdgeIndex(i1, j1);
				tr1[1] = GetEdgeIndex(j1, k1);
				tr1[2] = GetEdgeIndex(k1, i1);
				std::set<long>::const_iterator it2(it1);
				for(++it2; it2 != itEnd; ++it2)
				{
                    t2 = *it2;
                    i2 = m_triangles[t2].X();
                    j2 = m_triangles[t2].Y();
                    k2 = m_triangles[t2].Z();
					tr2[0] = GetEdgeIndex(i2, j2);
					tr2[1] = GetEdgeIndex(j2, k2);
					tr2[2] = GetEdgeIndex(k2, i2);
					int shared = 0;
					for(int i = 0; i < 3; ++i)
					{
						for(int j = 0; j < 3; ++j)
						{
							if (tr1[i] == tr2[j])	
							{
								shared++;
							}
						}
					}
					if (shared == 1) // two triangles are connected if they share exactly one edge
					{
						m_graph.AddEdge(t1, t2);
					}
				}
			}
        }
        if (m_ccConnectDist >= 0.0)
        {
            m_graph.ExtractCCs();
            if (m_callBack)
            {
                char msg[1024];
                sprintf(msg, "nCC " SIZET_FMT "\n", m_graph.m_nCCs);
                (*m_callBack)(msg, 0.0, 0.0,  m_graph.GetNVertices());
                
            }
            
            if (m_graph.m_nCCs > 1) 
            {
                std::vector< std::set<long> > cc2V;
                cc2V.resize(m_graph.m_nCCs);
                long cc;
                for(size_t t = 0; t < m_nTriangles; ++t)
                {
                    cc = m_graph.m_vertices[t].m_cc;
                    cc2V[cc].insert(m_triangles[t].X());
                    cc2V[cc].insert(m_triangles[t].Y());
                    cc2V[cc].insert(m_triangles[t].Z());
                }
                
                for(size_t cc1 = 0; cc1 < m_graph.m_nCCs; ++cc1)
                {
                    for(size_t cc2 = cc1+1; cc2 < m_graph.m_nCCs; ++cc2)
                    {
                        std::set<long>::const_iterator itV1(cc2V[cc1].begin()), itVEnd1(cc2V[cc1].end()); 
                        for(; itV1 != itVEnd1; ++itV1)
                        {
							double distC1C2 = std::numeric_limits<double>::max();
                            double dist;
                            t1 = -1;
                            t2 = -1;
                            std::set<long>::const_iterator itV2(cc2V[cc2].begin()), itVEnd2(cc2V[cc2].end()); 
                            for(; itV2 != itVEnd2; ++itV2)
                            {
                                dist = (m_points[*itV1] - m_points[*itV2]).GetNorm();
                                if (dist < distC1C2)
                                {
                                    distC1C2 = dist;
                                    t1 = *vertexToTriangles[*itV1].begin();
                                    
									std::set<long>::const_iterator it2(vertexToTriangles[*itV2].begin()), 
																   it2End(vertexToTriangles[*itV2].end()); 
									t2 = -1;
									for(; it2 != it2End; ++it2)
									{
										if (*it2 != t1)
										{
											t2 = *it2;
											break;
										}
									}
                                }
                            }
                            if (distC1C2 <= m_ccConnectDist && t1 >= 0 && t2 >= 0)
                            {
                                m_graph.AddEdge(t1, t2);                    
                            }
                        }
                    }
                }
            }
        }
    }